

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,InterfaceInstantiationStmt *stmt)

{
  char cVar1;
  uint32_t uVar2;
  ulong uVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostream *poVar5;
  __shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar6;
  string *psVar7;
  InstantiationStmt *local_100;
  string local_98 [32];
  string_view local_78;
  InterfaceRef *local_68;
  InterfaceRef **local_60;
  InterfaceRef **interface;
  string local_48;
  string_view local_28;
  InterfaceInstantiationStmt *local_18;
  InterfaceInstantiationStmt *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  local_18 = stmt;
  stmt_local = (InterfaceInstantiationStmt *)this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_28 = indent(this);
    pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                             &(this->stream_).super_stringstream.field_0x10,local_28);
    poVar5 = std::operator<<(pbVar4,"// ");
    strip_newline(&local_48,&(local_18->super_Stmt).super_IRNode.comment);
    poVar5 = std::operator<<(poVar5,(string *)&local_48);
    cVar1 = Stream::endl(&this->stream_);
    std::operator<<(poVar5,cVar1);
    std::__cxx11::string::~string((string *)&local_48);
  }
  uVar2 = Stream::line_no(&this->stream_);
  (local_18->super_Stmt).super_IRNode.verilog_ln = uVar2;
  local_68 = InterfaceInstantiationStmt::interface(local_18);
  local_60 = &local_68;
  local_78 = indent(this);
  pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,local_78);
  this_00 = (__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            InterfaceRef::definition(*local_60);
  peVar6 = std::__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(this_00);
  (*peVar6->_vptr_IDefinition[7])();
  poVar5 = std::operator<<(pbVar4,local_98);
  poVar5 = std::operator<<(poVar5," ");
  psVar7 = InterfaceRef::name_abi_cxx11_(*local_60);
  std::operator<<(poVar5,(string *)psVar7);
  std::__cxx11::string::~string(local_98);
  local_100 = (InstantiationStmt *)0x0;
  if (local_18 != (InterfaceInstantiationStmt *)0x0) {
    local_100 = &local_18->super_InstantiationStmt;
  }
  generate_port_interface(this,local_100);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::InterfaceInstantiationStmt* stmt) {
    // comment
    if (!stmt->comment.empty()) {
        stream_ << indent() << "// " << strip_newline(stmt->comment) << stream_.endl();
    }
    stmt->verilog_ln = stream_.line_no();
    auto const& interface = stmt->interface();
    stream_ << indent() << interface->definition()->def_name() << " " << interface->name();
    // TODO: allow parametrization
    generate_port_interface(stmt);
}